

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_tests.cpp
# Opt level: O0

void __thiscall
syntax_tests::iu_SyntaxTest_x_iutest_x_Pred3_Test::~iu_SyntaxTest_x_iutest_x_Pred3_Test
          (iu_SyntaxTest_x_iutest_x_Pred3_Test *this)

{
  iu_SyntaxTest_x_iutest_x_Pred3_Test *this_local;
  
  ~iu_SyntaxTest_x_iutest_x_Pred3_Test(this);
  operator_delete(this,0x30);
  return;
}

Assistant:

IUTEST(SyntaxTest, Pred3)
{
    if( int x=1 )
        IUTEST_ASSERT_PRED3(PredTest3, 0, x, 2) << x;
    if( int x=1 )
        IUTEST_EXPECT_PRED3(PredTest3, 0, x, 2) << x;
    if( int x=1 )
        IUTEST_INFORM_PRED3(PredTest3, 0, x, 2) << x;
    if( int x=1 )
        IUTEST_ASSUME_PRED3(PredTest3, 0, x, 2) << x;
}